

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

size_t __thiscall slang::SourceManager::getColumnNumber(SourceManager *this,SourceLocation location)

{
  char cVar1;
  FileData *pFVar2;
  pointer pcVar3;
  FileInfo *pFVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  
  pFVar4 = getFileInfo(this,(BufferID)(location._0_4_ & 0xfffffff));
  if ((pFVar4 == (FileInfo *)0x0) || (pFVar2 = pFVar4->data, pFVar2 == (FileData *)0x0)) {
    sVar7 = 0;
  }
  else {
    uVar6 = (ulong)location >> 0x1c;
    pcVar3 = (pFVar2->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(pFVar2->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pcVar3) <= uVar6) {
      assert::assertFailed
                ("lineStart < fd->mem.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SourceManager.cpp"
                 ,0x40,"size_t slang::SourceManager::getColumnNumber(SourceLocation) const");
    }
    lVar5 = uVar6 + 1;
    while (lVar5 != 1) {
      cVar1 = pcVar3[lVar5 + -2];
      lVar5 = lVar5 + -1;
      if ((cVar1 == '\r') || (cVar1 == '\n')) goto LAB_001a7eb8;
    }
    lVar5 = 0;
LAB_001a7eb8:
    sVar7 = (uVar6 - lVar5) + 1;
  }
  return sVar7;
}

Assistant:

size_t SourceManager::getColumnNumber(SourceLocation location) const {
    auto info = getFileInfo(location.buffer());

    // LOCKING: don't need a lock here, data is always valid once loaded.
    if (!info || !info->data)
        return 0;

    // walk backward to find start of line
    auto fd = info->data;
    size_t lineStart = location.offset();
    ASSERT(lineStart < fd->mem.size());
    while (lineStart > 0 && fd->mem[lineStart - 1] != '\n' && fd->mem[lineStart - 1] != '\r')
        lineStart--;

    return location.offset() - lineStart + 1;
}